

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O3

int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og,int force,int nfill)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  uint *__dest;
  byte bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  
  puVar2 = os->body_data;
  lVar3 = os->lacing_fill;
  lVar5 = 0xff;
  if (lVar3 < 0xff) {
    lVar5 = lVar3;
  }
  uVar9 = (uint)lVar5;
  if (uVar9 == 0 || puVar2 == (uchar *)0x0) {
    return 0;
  }
  iVar1 = os->b_o_s;
  if (iVar1 == 0) {
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    else {
      uVar12 = 0;
      do {
        if ((char)os->lacing_vals[uVar12] != -1) {
          uVar9 = (int)uVar12 + 1;
          lVar5 = 0;
          goto LAB_001e5624;
        }
        uVar12 = uVar12 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar12);
    }
    lVar5 = 0;
  }
  else if ((int)uVar9 < 1) {
    lVar5 = -1;
    uVar9 = 0;
  }
  else {
    lVar5 = -1;
    uVar12 = 0;
    iVar11 = 0;
    iVar6 = 0;
    lVar10 = 0;
    do {
      if ((nfill < lVar10) && (3 < iVar11)) {
        force = 1;
        uVar9 = (uint)uVar12;
        break;
      }
      iVar11 = 0;
      if ((ulong)*(byte *)(os->lacing_vals + uVar12) != 0xff) {
        lVar5 = os->granule_vals[uVar12];
        iVar6 = iVar6 + 1;
        iVar11 = iVar6;
      }
      lVar10 = lVar10 + (ulong)*(byte *)(os->lacing_vals + uVar12);
      uVar12 = uVar12 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar12);
    uVar8 = 0xff;
    if (uVar9 == 0xff) goto LAB_001e5630;
  }
LAB_001e5624:
  uVar8 = uVar9;
  if (force == 0) {
    return 0;
  }
LAB_001e5630:
  builtin_memcpy(os->header,"OggS",5);
  os->header[5] = '\0';
  __dest = (uint *)os->lacing_vals;
  bVar13 = (*__dest >> 8 & 1) == 0;
  bVar4 = bVar13 + 2;
  if (iVar1 != 0) {
    bVar4 = bVar13;
  }
  os->header[5] = bVar4;
  lVar10 = (long)(int)uVar8;
  if ((os->e_o_s != 0) && (lVar3 == lVar10)) {
    os->header[5] = bVar4 | 4;
  }
  os->b_o_s = 1;
  lVar7 = 0;
  do {
    os->header[lVar7 + 6] = (uchar)lVar5;
    lVar5 = lVar5 >> 8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  lVar5 = os->serialno;
  lVar7 = 0;
  do {
    os->header[lVar7 + 0xe] = (uchar)lVar5;
    lVar5 = lVar5 >> 8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  lVar5 = os->pageno;
  if (os->pageno == -1) {
    lVar5 = lVar7;
  }
  os->pageno = lVar5 + 1;
  do {
    os->header[lVar7 + 0x12] = (uchar)lVar5;
    lVar5 = lVar5 >> 8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  os->header[0x16] = '\0';
  os->header[0x17] = '\0';
  os->header[0x18] = '\0';
  os->header[0x19] = '\0';
  os->header[0x1a] = (uchar)uVar8;
  uVar12 = 0;
  if (0 < (int)uVar8) {
    lVar5 = 0;
    do {
      uVar9 = __dest[lVar5];
      os->header[lVar5 + 0x1b] = (uchar)uVar9;
      uVar9 = (int)uVar12 + (uVar9 & 0xff);
      uVar12 = (ulong)uVar9;
      lVar5 = lVar5 + 1;
    } while (lVar10 != lVar5);
    uVar12 = (ulong)uVar9;
  }
  og->header = os->header;
  os->header_fill = uVar8 + 0x1b;
  og->header_len = (long)(int)(uVar8 + 0x1b);
  og->body = puVar2 + os->body_returned;
  og->body_len = uVar12;
  os->lacing_fill = lVar3 - lVar10;
  memmove(__dest,__dest + lVar10,(lVar3 - lVar10) * 4);
  memmove(os->granule_vals,os->granule_vals + lVar10,os->lacing_fill << 3);
  os->body_returned = os->body_returned + uVar12;
  ogg_page_checksum_set(og);
  return 1;
}

Assistant:

static int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og, int force, int nfill){
  int i;
  int vals=0;
  int maxvals=(os->lacing_fill>255?255:os->lacing_fill);
  int bytes=0;
  long acc=0;
  ogg_int64_t granule_pos=-1;

  if(ogg_stream_check(os)) return(0);
  if(maxvals==0) return(0);

  /* construct a page */
  /* decide how many segments to include */

  /* If this is the initial header case, the first page must only include
     the initial header packet */
  if(os->b_o_s==0){  /* 'initial header page' case */
    granule_pos=0;
    for(vals=0;vals<maxvals;vals++){
      if((os->lacing_vals[vals]&0x0ff)<255){
        vals++;
        break;
      }
    }
  }else{

    /* The extra packets_done, packet_just_done logic here attempts to do two things:
       1) Don't unnecessarily span pages.
       2) Unless necessary, don't flush pages if there are less than four packets on
          them; this expands page size to reduce unnecessary overhead if incoming packets
          are large.
       These are not necessary behaviors, just 'always better than naive flushing'
       without requiring an application to explicitly request a specific optimized
       behavior. We'll want an explicit behavior setup pathway eventually as well. */

    int packets_done=0;
    int packet_just_done=0;
    for(vals=0;vals<maxvals;vals++){
      if(acc>nfill && packet_just_done>=4){
        force=1;
        break;
      }
      acc+=os->lacing_vals[vals]&0x0ff;
      if((os->lacing_vals[vals]&0xff)<255){
        granule_pos=os->granule_vals[vals];
        packet_just_done=++packets_done;
      }else
        packet_just_done=0;
    }
    if(vals==255)force=1;
  }

  if(!force) return(0);

  /* construct the header in temp storage */
  memcpy(os->header,"OggS",4);

  /* stream structure version */
  os->header[4]=0x00;

  /* continued packet flag? */
  os->header[5]=0x00;
  if((os->lacing_vals[0]&0x100)==0)os->header[5]|=0x01;
  /* first page flag? */
  if(os->b_o_s==0)os->header[5]|=0x02;
  /* last page flag? */
  if(os->e_o_s && os->lacing_fill==vals)os->header[5]|=0x04;
  os->b_o_s=1;

  /* 64 bits of PCM position */
  for(i=6;i<14;i++){
    os->header[i]=(unsigned char)(granule_pos&0xff);
    granule_pos>>=8;
  }

  /* 32 bits of stream serial number */
  {
    long serialno=os->serialno;
    for(i=14;i<18;i++){
      os->header[i]=(unsigned char)(serialno&0xff);
      serialno>>=8;
    }
  }

  /* 32 bits of page counter (we have both counter and page header
     because this val can roll over) */
  if(os->pageno==-1)os->pageno=0; /* because someone called
                                     stream_reset; this would be a
                                     strange thing to do in an
                                     encode stream, but it has
                                     plausible uses */
  {
    long pageno=os->pageno++;
    for(i=18;i<22;i++){
      os->header[i]=(unsigned char)(pageno&0xff);
      pageno>>=8;
    }
  }

  /* zero for computation; filled in later */
  os->header[22]=0;
  os->header[23]=0;
  os->header[24]=0;
  os->header[25]=0;

  /* segment table */
  os->header[26]=(unsigned char)(vals&0xff);
  for(i=0;i<vals;i++)
    bytes+=os->header[i+27]=(unsigned char)(os->lacing_vals[i]&0xff);

  /* set pointers in the ogg_page struct */
  og->header=os->header;
  og->header_len=os->header_fill=vals+27;
  og->body=os->body_data+os->body_returned;
  og->body_len=bytes;

  /* advance the lacing data and set the body_returned pointer */

  os->lacing_fill-=vals;
  memmove(os->lacing_vals,os->lacing_vals+vals,os->lacing_fill*sizeof(*os->lacing_vals));
  memmove(os->granule_vals,os->granule_vals+vals,os->lacing_fill*sizeof(*os->granule_vals));
  os->body_returned+=bytes;

  /* calculate the checksum */

  ogg_page_checksum_set(og);

  /* done */
  return(1);
}